

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t i;
  sysbvm_tuple_t sVar3;
  anon_struct_24_3_ee1c534f gcFrame;
  sysbvm_astFunctionApplicationNode_t *local_d8;
  sysbvm_tuple_t sStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_68;
  undefined8 local_58;
  sysbvm_astFunctionApplicationNode_t **local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_50 = &local_d8;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = (sysbvm_astFunctionApplicationNode_t *)0x0;
  sStack_d0 = 0;
  local_88 = 0;
  local_68.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_68.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_68._12_4_ = 0;
  local_58 = 0xb;
  sysbvm_stackFrame_pushRecord(&local_68);
  local_d8 = (sysbvm_astFunctionApplicationNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  (local_d8->super).analyzerToken = sVar2;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = (local_d8->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sStack_d0 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                        (context,local_d8->functionExpression,arguments[1]);
  local_d8->functionExpression = sStack_d0;
  if ((sStack_d0 & 0xf) == 0 && sStack_d0 != 0) {
    local_98 = *(sysbvm_tuple_t *)(sStack_d0 + 0x20);
  }
  else {
    local_98 = 0;
  }
  sVar2 = sysbvm_tuple_getType(context,local_98);
  sStack_90 = sysbvm_type_getAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment
                        (context,sVar2);
  if (sStack_90 == 0) {
    gcFrame.argumentNode = 0;
    gcFrame.analyzedArgument = 0;
    gcFrame.analyzedArguments = 0;
    local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_48._12_4_ = 0;
    local_38 = 3;
    local_30 = (undefined1 *)&gcFrame;
    sysbvm_stackFrame_pushRecord(&local_48);
    uVar1 = local_d8->arguments;
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      sVar2 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
    }
    else {
      sVar2 = 0;
    }
    gcFrame.analyzedArguments = sysbvm_array_create(context,sVar2);
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      uVar1 = local_d8->arguments;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        gcFrame.argumentNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8);
      }
      else {
        gcFrame.argumentNode = 0;
      }
      gcFrame.analyzedArgument =
           sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                     (context,gcFrame.argumentNode,arguments[1]);
      if ((gcFrame.analyzedArguments & 0xf) == 0 && gcFrame.analyzedArguments != 0) {
        *(sysbvm_tuple_t *)(gcFrame.analyzedArguments + 0x10 + sVar3 * 8) = gcFrame.analyzedArgument
        ;
      }
    }
    local_d8->arguments = gcFrame.analyzedArguments;
    (local_d8->super).analyzedType = (context->roots).anyValueType;
    sysbvm_stackFrame_popRecord(&local_48);
    local_88 = sysbvm_astFunctionApplicationNode_optimizePureApplication(context,&local_d8);
  }
  else {
    local_88 = sysbvm_function_apply3
                         (context,sStack_90,local_98,(sysbvm_tuple_t)local_d8,arguments[1]);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_68);
  return local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astFunctionApplicationNode_t *applicationNode;
        sysbvm_tuple_t analyzedFunctionExpression;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        
        sysbvm_tuple_t literalFunction;
        sysbvm_tuple_t pureCallResult;
        sysbvm_tuple_t argumentValue;
        sysbvm_tuple_t functionType;

        sysbvm_tuple_t typeCheckFunction;

        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.applicationNode = (sysbvm_astFunctionApplicationNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.applicationNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.applicationNode->super.sourcePosition);

    gcFrame.analyzedFunctionExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.applicationNode->functionExpression, *environment);
    gcFrame.applicationNode->functionExpression = gcFrame.analyzedFunctionExpression;
    gcFrame.functionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedFunctionExpression);

    // Type check the function application.
    gcFrame.typeCheckFunction = sysbvm_type_getAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.functionType));
    if(gcFrame.typeCheckFunction)
        gcFrame.result = sysbvm_function_apply3(context, gcFrame.typeCheckFunction, gcFrame.functionType, (sysbvm_tuple_t)gcFrame.applicationNode, *environment);
    else
        gcFrame.result = sysbvm_astFunctionApplicationNode_defaultTypeCheck(context, &gcFrame.applicationNode, environment);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}